

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_else(CTcTokenizer *this)

{
  int iVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  tok_if_t tVar4;
  CTcTokenizer *in_RDI;
  
  tVar2 = next_on_line((CTcTokenizer *)0x295128);
  if (tVar2 != TOKT_EOF) {
    log_error(0x2720);
  }
  iVar1 = in_RDI->if_sp_;
  iVar3 = CTcTokStream::get_init_if_level(in_RDI->str_);
  if (iVar1 <= iVar3) {
    log_error(0x2740);
    clear_linebuf(in_RDI);
    return;
  }
  tVar4 = get_if_state(in_RDI);
  if (tVar4 == TOKIF_NONE) {
LAB_002951d5:
    log_error(0x2722);
  }
  else {
    if (tVar4 != TOKIF_IF_YES) {
      if (tVar4 == TOKIF_IF_NO) {
        change_if_state(in_RDI,TOKIF_ELSE_YES);
        goto LAB_002951e1;
      }
      if (tVar4 != TOKIF_IF_DONE) {
        if (1 < tVar4 - TOKIF_ELSE_YES) goto LAB_002951e1;
        goto LAB_002951d5;
      }
    }
    change_if_state(in_RDI,TOKIF_ELSE_NO);
  }
LAB_002951e1:
  clear_linebuf(in_RDI);
  return;
}

Assistant:

void CTcTokenizer::pp_else()
{
    /* make sure there's nothing but whitespace on the line */
    if (next_on_line() != TOKT_EOF)
        log_error(TCERR_PP_EXTRA);

    /* 
     *   make sure that the #else occurs in the same file as the
     *   corresponding #if 
     */
    if (if_sp_ <= str_->get_init_if_level())
    {
        /* log the error */
        log_error(TCERR_PP_ELSE_NOT_IN_SAME_FILE);

        /* clear the text and abort */
        clear_linebuf();
        return;
    }

    /* check our current #if state */
    switch(get_if_state())
    {
    case TOKIF_IF_YES:
    case TOKIF_IF_DONE:
        /* 
         *   we've already taken a true #if branch, so we don't want to
         *   process the #else part - switch to a false #else branch 
         */
        change_if_state(TOKIF_ELSE_NO);
        break;

    case TOKIF_IF_NO:
        /* 
         *   we haven't yet found a true #if branch, so take the #else
         *   branch -- switch to a true #else branch 
         */
        change_if_state(TOKIF_ELSE_YES);
        break;

    case TOKIF_NONE:
    case TOKIF_ELSE_YES:
    case TOKIF_ELSE_NO:
        /* 
         *   we're not in a #if at all, or we're in a #else - log an error
         *   and ignore it 
         */
        log_error(TCERR_PP_ELSE_WITHOUT_IF);
        break;
    }

    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}